

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O0

void vkt::wsi::anon_unknown_0::deinitImageViews
               (DeviceInterface *vkd,VkDevice device,
               vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               *imageViews)

{
  ulong uVar1;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_> *pvVar2;
  VkDevice pVVar3;
  bool bVar4;
  size_type sVar5;
  reference pvVar6;
  Handle<(vk::HandleType)13> local_40;
  deUint64 local_38;
  Handle<(vk::HandleType)13> local_30;
  ulong local_28;
  size_t ndx;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  *imageViews_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  
  ndx = (size_t)imageViews;
  imageViews_local =
       (vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_> *)
       device;
  device_local = (VkDevice)vkd;
  for (local_28 = 0; uVar1 = local_28,
      sVar5 = std::
              vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ::size((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                      *)ndx), uVar1 < sVar5; local_28 = local_28 + 1) {
    pvVar6 = std::
             vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             ::operator[]((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                           *)ndx,local_28);
    ::vk::Handle<(vk::HandleType)13>::Handle(&local_30,0);
    bVar4 = ::vk::Handle<(vk::HandleType)13>::operator!=(pvVar6,&local_30);
    pVVar3 = device_local;
    pvVar2 = imageViews_local;
    if (bVar4) {
      pvVar6 = std::
               vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               ::operator[]((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                             *)ndx,local_28);
      local_38 = pvVar6->m_internal;
      (**(code **)(*(long *)pVVar3 + 0x148))(pVVar3,pvVar2,local_38,0);
    }
    ::vk::Handle<(vk::HandleType)13>::Handle(&local_40,0);
    pvVar6 = std::
             vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             ::operator[]((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                           *)ndx,local_28);
    pvVar6->m_internal = local_40.m_internal;
  }
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  clear((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_> *)
        ndx);
  return;
}

Assistant:

void deinitImageViews (const vk::DeviceInterface&		vkd,
					   vk::VkDevice						device,
					   std::vector<vk::VkImageView>&	imageViews)
{
	for (size_t ndx = 0; ndx < imageViews.size(); ndx++)
	{
		if (imageViews[ndx] != (vk::VkImageView)0)
			vkd.destroyImageView(device, imageViews[ndx], DE_NULL);

		imageViews[ndx] = (vk::VkImageView)0;
	}

	imageViews.clear();
}